

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O2

ssize_t __thiscall
wasm::LEB<int,_signed_char>::read(LEB<int,_signed_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  ParseException *pPVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  allocator<char> local_31;
  
  this->value = 0;
  bVar3 = 0;
  uVar8 = 0;
  while( true ) {
    bVar1 = std::function<signed_char_()>::operator()
                      ((function<signed_char_()> *)CONCAT44(in_register_00000034,__fd));
    uVar6 = ~(-1 << (bVar3 & 0x1f)) & 0x7f;
    if (uVar8 == 0) {
      uVar6 = 0x7f;
    }
    uVar7 = (uint)bVar1 & (uVar6 ^ 0x7f);
    uVar4 = (uVar6 & bVar1) << ((byte)uVar8 & 0x1f) | this->value;
    this->value = uVar4;
    if ((int)uVar4 < 0) {
      if (uVar7 != (uVar6 ^ 0x7f)) {
        pPVar2 = (ParseException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Unused negative LEB bits must be 1s",&local_31);
        ParseException::ParseException(pPVar2,&local_b8);
        __cxa_throw(pPVar2,&ParseException::typeinfo,ParseException::~ParseException);
      }
    }
    else if (uVar7 != 0) {
      pPVar2 = (ParseException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Unused non-negative LEB bits must be 0s",&local_31);
      ParseException::ParseException(pPVar2,&local_98);
      __cxa_throw(pPVar2,&ParseException::typeinfo,ParseException::~ParseException);
    }
    if (-1 < (char)bVar1) break;
    bVar3 = bVar3 - 7;
    bVar9 = 0x18 < uVar8;
    uVar8 = uVar8 + 7;
    if (bVar9) {
      pPVar2 = (ParseException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"LEB overflow",&local_31);
      ParseException::ParseException(pPVar2,&local_78);
      __cxa_throw(pPVar2,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
  if (uVar8 < 0x19 && 0x3f < bVar1) {
    bVar3 = 0x19 - (byte)uVar8;
    iVar5 = (int)(uVar4 << (bVar3 & 0x1f)) >> (bVar3 & 0x1f);
    this->value = iVar5;
    if (-1 < iVar5) {
      pPVar2 = (ParseException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58," LEBsign-extend should produce a negative value",&local_31);
      ParseException::ParseException(pPVar2,&local_58);
      __cxa_throw(pPVar2,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
  return (ssize_t)this;
}

Assistant:

LEB<T, MiniT>& read(std::function<MiniT()> get) {
    value = 0;
    T shift = 0;
    MiniT byte;
    while (1) {
      byte = get();
      bool last = !(byte & 128);
      T payload = byte & 127;
      using mask_type = typename std::make_unsigned<T>::type;
      auto payload_mask = 0 == shift
                            ? ~mask_type(0)
                            : ((mask_type(1) << (sizeof(T) * 8 - shift)) - 1u);
      T significant_payload = payload_mask & payload;
      value |= significant_payload << shift;
      T unused_bits_mask = ~payload_mask & 127;
      T unused_bits = payload & unused_bits_mask;
      if (std::is_signed_v<T> && value < 0) {
        if (unused_bits != unused_bits_mask) {
          throw ParseException("Unused negative LEB bits must be 1s");
        }
      } else {
        if (unused_bits != 0) {
          throw ParseException("Unused non-negative LEB bits must be 0s");
        }
      }
      if (last) {
        break;
      }
      shift += 7;
      if (size_t(shift) >= sizeof(T) * 8) {
        throw ParseException("LEB overflow");
      }
    }
    // If signed LEB, then we might need to sign-extend.
    if constexpr (std::is_signed_v<T>) {
      shift += 7;
      if ((byte & 64) && size_t(shift) < 8 * sizeof(T)) {
        size_t sext_bits = 8 * sizeof(T) - size_t(shift);
        value <<= sext_bits;
        value >>= sext_bits;
        if (value >= 0) {
          throw ParseException(
            " LEBsign-extend should produce a negative value");
        }
      }
    }
    return *this;
  }